

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O0

void fits_setup_shape(RgnShape *newShape)

{
  double *pdVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double local_50;
  double local_48;
  int local_34;
  anon_union_120_2_131c4ffb_for_param *paStack_30;
  int i;
  double *coords;
  double R;
  double Y;
  double X;
  RgnShape *newShape_local;
  
  if (newShape->shape == poly_rgn) {
    paStack_30 = (anon_union_120_2_131c4ffb_for_param *)(newShape->param).poly.Pts;
  }
  else {
    paStack_30 = &newShape->param;
  }
  switch(newShape->shape) {
  case line_rgn:
    local_50 = (paStack_30->gen).p[2] - (paStack_30->gen).p[0];
    local_48 = (paStack_30->gen).p[3] - (paStack_30->gen).p[1];
    dVar4 = sqrt(local_50 * local_50 + local_48 * local_48);
    if ((dVar4 != 0.0) || (NAN(dVar4))) {
      local_48 = local_48 / dVar4;
    }
    else {
      local_48 = 0.0;
    }
    (newShape->param).gen.sinT = local_48;
    if ((dVar4 != 0.0) || (NAN(dVar4))) {
      local_50 = local_50 / dVar4;
    }
    else {
      local_50 = 1.0;
    }
    (newShape->param).gen.cosT = local_50;
    (newShape->param).gen.a = dVar4 + 0.5;
    break;
  case circle_rgn:
    (newShape->param).gen.a = (paStack_30->gen).p[2] * (paStack_30->gen).p[2];
    break;
  case annulus_rgn:
    (newShape->param).gen.a = (paStack_30->gen).p[2] * (paStack_30->gen).p[2];
    (newShape->param).gen.b = (paStack_30->gen).p[3] * (paStack_30->gen).p[3];
    break;
  case ellipse_rgn:
    dVar4 = sin(((paStack_30->gen).p[4] / 180.0) * 3.141592653589793);
    (newShape->param).gen.sinT = dVar4;
    dVar4 = cos(((paStack_30->gen).p[4] / 180.0) * 3.141592653589793);
    (newShape->param).gen.cosT = dVar4;
    break;
  case elliptannulus_rgn:
    dVar4 = sin(((paStack_30->gen).p[6] / 180.0) * 3.141592653589793);
    (newShape->param).gen.a = dVar4;
    dVar4 = cos(((paStack_30->gen).p[6] / 180.0) * 3.141592653589793);
    (newShape->param).gen.b = dVar4;
    dVar4 = sin(((paStack_30->gen).p[7] / 180.0) * 3.141592653589793);
    (newShape->param).gen.sinT = dVar4;
    dVar4 = cos(((paStack_30->gen).p[7] / 180.0) * 3.141592653589793);
    (newShape->param).gen.cosT = dVar4;
    break;
  case box_rgn:
    dVar4 = sin(((paStack_30->gen).p[4] / 180.0) * 3.141592653589793);
    (newShape->param).gen.sinT = dVar4;
    dVar4 = cos(((paStack_30->gen).p[4] / 180.0) * 3.141592653589793);
    (newShape->param).gen.cosT = dVar4;
    break;
  case boxannulus_rgn:
    dVar4 = sin(((paStack_30->gen).p[6] / 180.0) * 3.141592653589793);
    (newShape->param).gen.a = dVar4;
    dVar4 = cos(((paStack_30->gen).p[6] / 180.0) * 3.141592653589793);
    (newShape->param).gen.b = dVar4;
    dVar4 = sin(((paStack_30->gen).p[7] / 180.0) * 3.141592653589793);
    (newShape->param).gen.sinT = dVar4;
    dVar4 = cos(((paStack_30->gen).p[7] / 180.0) * 3.141592653589793);
    (newShape->param).gen.cosT = dVar4;
    break;
  case rectangle_rgn:
    dVar4 = sin(((paStack_30->gen).p[4] / 180.0) * 3.141592653589793);
    (newShape->param).gen.sinT = dVar4;
    dVar4 = cos(((paStack_30->gen).p[4] / 180.0) * 3.141592653589793);
    (newShape->param).gen.cosT = dVar4;
    dVar4 = ((paStack_30->gen).p[2] - (paStack_30->gen).p[0]) * 0.5;
    dVar3 = ((paStack_30->gen).p[3] - (paStack_30->gen).p[1]) * 0.5;
    (newShape->param).gen.a =
         ABS(dVar4 * (newShape->param).gen.cosT + dVar3 * (newShape->param).gen.sinT);
    (newShape->param).gen.b =
         ABS(dVar3 * (newShape->param).gen.cosT + -(dVar4 * (newShape->param).gen.sinT));
    (newShape->param).gen.p[5] = ((paStack_30->gen).p[2] + (paStack_30->gen).p[0]) * 0.5;
    (newShape->param).gen.p[6] = ((paStack_30->gen).p[3] + (paStack_30->gen).p[1]) * 0.5;
    break;
  case diamond_rgn:
    dVar4 = sin(((paStack_30->gen).p[4] / 180.0) * 3.141592653589793);
    (newShape->param).gen.sinT = dVar4;
    dVar4 = cos(((paStack_30->gen).p[4] / 180.0) * 3.141592653589793);
    (newShape->param).gen.cosT = dVar4;
    break;
  case sector_rgn:
    while (180.0 < (paStack_30->gen).p[2]) {
      (paStack_30->gen).p[2] = (paStack_30->gen).p[2] - 360.0;
    }
    while ((paStack_30->gen).p[2] <= -180.0) {
      (paStack_30->gen).p[2] = (paStack_30->gen).p[2] + 360.0;
    }
    while (180.0 < (paStack_30->gen).p[3]) {
      (paStack_30->gen).p[3] = (paStack_30->gen).p[3] - 360.0;
    }
    while ((paStack_30->gen).p[3] <= -180.0) {
      (paStack_30->gen).p[3] = (paStack_30->gen).p[3] + 360.0;
    }
    break;
  default:
    break;
  case panda_rgn:
    while (180.0 < (paStack_30->gen).p[2]) {
      (paStack_30->gen).p[2] = (paStack_30->gen).p[2] - 360.0;
    }
    while ((paStack_30->gen).p[2] <= -180.0) {
      (paStack_30->gen).p[2] = (paStack_30->gen).p[2] + 360.0;
    }
    while (180.0 < (paStack_30->gen).p[3]) {
      (paStack_30->gen).p[3] = (paStack_30->gen).p[3] - 360.0;
    }
    while ((paStack_30->gen).p[3] <= -180.0) {
      (paStack_30->gen).p[3] = (paStack_30->gen).p[3] + 360.0;
    }
    (newShape->param).gen.a = (newShape->param).gen.p[5] * (newShape->param).gen.p[5];
    (newShape->param).gen.b = (newShape->param).gen.p[6] * (newShape->param).gen.p[6];
    break;
  case epanda_rgn:
  case bpanda_rgn:
    while (180.0 < (paStack_30->gen).p[2]) {
      (paStack_30->gen).p[2] = (paStack_30->gen).p[2] - 360.0;
    }
    while ((paStack_30->gen).p[2] <= -180.0) {
      (paStack_30->gen).p[2] = (paStack_30->gen).p[2] + 360.0;
    }
    while (180.0 < (paStack_30->gen).p[3]) {
      (paStack_30->gen).p[3] = (paStack_30->gen).p[3] - 360.0;
    }
    while ((paStack_30->gen).p[3] <= -180.0) {
      (paStack_30->gen).p[3] = (paStack_30->gen).p[3] + 360.0;
    }
    dVar4 = sin(((paStack_30->gen).p[10] / 180.0) * 3.141592653589793);
    (newShape->param).gen.sinT = dVar4;
    dVar4 = cos(((paStack_30->gen).p[10] / 180.0) * 3.141592653589793);
    (newShape->param).gen.cosT = dVar4;
  }
  coords = (double *)0xbff0000000000000;
  switch(newShape->shape) {
  case point_rgn:
    coords = (double *)0x3ff0000000000000;
    break;
  default:
    break;
  case circle_rgn:
    coords = (double *)(paStack_30->gen).p[2];
    break;
  case annulus_rgn:
    coords = (double *)(paStack_30->gen).p[3];
    break;
  case ellipse_rgn:
    if ((paStack_30->gen).p[2] < (paStack_30->gen).p[3] ||
        (paStack_30->gen).p[2] == (paStack_30->gen).p[3]) {
      coords = (double *)(paStack_30->gen).p[3];
    }
    else {
      coords = (double *)(paStack_30->gen).p[2];
    }
    break;
  case elliptannulus_rgn:
    if ((paStack_30->gen).p[4] < (paStack_30->gen).p[5] ||
        (paStack_30->gen).p[4] == (paStack_30->gen).p[5]) {
      coords = (double *)(paStack_30->gen).p[5];
    }
    else {
      coords = (double *)(paStack_30->gen).p[4];
    }
    break;
  case box_rgn:
    dVar4 = sqrt((paStack_30->gen).p[2] * (paStack_30->gen).p[2] +
                 (paStack_30->gen).p[3] * (paStack_30->gen).p[3]);
    coords = (double *)(dVar4 / 2.0);
    break;
  case boxannulus_rgn:
    dVar4 = sqrt((paStack_30->gen).p[4] * (paStack_30->gen).p[5] +
                 (paStack_30->gen).p[4] * (paStack_30->gen).p[5]);
    coords = (double *)(dVar4 / 2.0);
    break;
  case diamond_rgn:
    if ((paStack_30->gen).p[2] < (paStack_30->gen).p[3] ||
        (paStack_30->gen).p[2] == (paStack_30->gen).p[3]) {
      dVar4 = (paStack_30->gen).p[3];
    }
    else {
      dVar4 = (paStack_30->gen).p[2];
    }
    coords = (double *)(dVar4 / 2.0);
    break;
  case panda_rgn:
    coords = (double *)(paStack_30->gen).p[6];
    break;
  case epanda_rgn:
    if ((paStack_30->gen).p[7] < (paStack_30->gen).p[8] ||
        (paStack_30->gen).p[7] == (paStack_30->gen).p[8]) {
      coords = (double *)(paStack_30->gen).p[8];
    }
    else {
      coords = (double *)(paStack_30->gen).p[7];
    }
    break;
  case bpanda_rgn:
    dVar4 = sqrt((paStack_30->gen).p[7] * (paStack_30->gen).p[8] +
                 (paStack_30->gen).p[7] * (paStack_30->gen).p[8]);
    coords = (double *)(dVar4 / 2.0);
  }
  if (0.0 < (double)coords) {
    newShape->xmin = (paStack_30->gen).p[0] - (double)coords;
    newShape->xmax = (paStack_30->gen).p[0] + (double)coords;
    newShape->ymin = (paStack_30->gen).p[1] - (double)coords;
    newShape->ymax = (paStack_30->gen).p[1] + (double)coords;
  }
  else {
    switch(newShape->shape) {
    case line_rgn:
      if ((paStack_30->gen).p[0] < (paStack_30->gen).p[2] ||
          (paStack_30->gen).p[0] == (paStack_30->gen).p[2]) {
        newShape->xmin = (paStack_30->gen).p[0];
        newShape->xmax = (paStack_30->gen).p[2];
      }
      else {
        newShape->xmin = (paStack_30->gen).p[2];
        newShape->xmax = (paStack_30->gen).p[0];
      }
      if ((paStack_30->gen).p[1] < (paStack_30->gen).p[3] ||
          (paStack_30->gen).p[1] == (paStack_30->gen).p[3]) {
        newShape->ymin = (paStack_30->gen).p[1];
        newShape->ymax = (paStack_30->gen).p[3];
      }
      else {
        newShape->ymin = (paStack_30->gen).p[3];
        newShape->ymax = (paStack_30->gen).p[1];
      }
      break;
    default:
      break;
    case rectangle_rgn:
      dVar4 = sqrt(((paStack_30->gen).p[5] - (paStack_30->gen).p[0]) *
                   ((paStack_30->gen).p[5] - (paStack_30->gen).p[0]) +
                   ((paStack_30->gen).p[6] - (paStack_30->gen).p[1]) *
                   ((paStack_30->gen).p[6] - (paStack_30->gen).p[1]));
      newShape->xmin = (paStack_30->gen).p[5] - dVar4;
      newShape->xmax = (paStack_30->gen).p[5] + dVar4;
      newShape->ymin = (paStack_30->gen).p[6] - dVar4;
      newShape->ymax = (paStack_30->gen).p[6] + dVar4;
      break;
    case sector_rgn:
      newShape->xmin = 1.0;
      newShape->xmax = -1.0;
      newShape->ymin = 1.0;
      newShape->ymax = -1.0;
      break;
    case poly_rgn:
      newShape->xmin = (paStack_30->gen).p[0];
      newShape->xmax = (paStack_30->gen).p[0];
      newShape->ymin = (paStack_30->gen).p[1];
      newShape->ymax = (paStack_30->gen).p[1];
      for (local_34 = 2; local_34 < (newShape->param).poly.nPts; local_34 = local_34 + 2) {
        pdVar1 = (double *)((long)paStack_30 + (long)local_34 * 8);
        if (*pdVar1 <= newShape->xmin && newShape->xmin != *pdVar1) {
          newShape->xmin = *(double *)((long)paStack_30 + (long)local_34 * 8);
        }
        if (newShape->xmax < *(double *)((long)paStack_30 + (long)local_34 * 8)) {
          newShape->xmax = *(double *)((long)paStack_30 + (long)local_34 * 8);
        }
        iVar2 = local_34 + 1;
        pdVar1 = (double *)((long)paStack_30 + (long)iVar2 * 8);
        if (*pdVar1 <= newShape->ymin && newShape->ymin != *pdVar1) {
          newShape->ymin = *(double *)((long)paStack_30 + (long)iVar2 * 8);
        }
        if (newShape->ymax < *(double *)((long)paStack_30 + (long)iVar2 * 8)) {
          newShape->ymax = *(double *)((long)paStack_30 + (long)iVar2 * 8);
        }
      }
    }
  }
  return;
}

Assistant:

void fits_setup_shape ( RgnShape *newShape)
{
/* Perform some useful calculations now to speed up filter later             */

  double X, Y, R;
  double *coords;
  int i;

  if ( newShape->shape == poly_rgn ) {
    coords = newShape->param.poly.Pts;
  } else {
    coords = newShape->param.gen.p;
  }

  switch( newShape->shape ) {
  case circle_rgn:
    newShape->param.gen.a = coords[2] * coords[2];
    break;
  case annulus_rgn:
    newShape->param.gen.a = coords[2] * coords[2];
    newShape->param.gen.b = coords[3] * coords[3];
    break;
  case sector_rgn:
    while( coords[2]> 180.0 ) coords[2] -= 360.0;
    while( coords[2]<=-180.0 ) coords[2] += 360.0;
    while( coords[3]> 180.0 ) coords[3] -= 360.0;
    while( coords[3]<=-180.0 ) coords[3] += 360.0;
    break;
  case ellipse_rgn:
    newShape->param.gen.sinT = sin( myPI * (coords[4] / 180.0) );
    newShape->param.gen.cosT = cos( myPI * (coords[4] / 180.0) );
    break;
  case elliptannulus_rgn:
    newShape->param.gen.a    = sin( myPI * (coords[6] / 180.0) );
    newShape->param.gen.b    = cos( myPI * (coords[6] / 180.0) );
    newShape->param.gen.sinT = sin( myPI * (coords[7] / 180.0) );
    newShape->param.gen.cosT = cos( myPI * (coords[7] / 180.0) );
    break;
  case box_rgn:
    newShape->param.gen.sinT = sin( myPI * (coords[4] / 180.0) );
    newShape->param.gen.cosT = cos( myPI * (coords[4] / 180.0) );
    break;
  case boxannulus_rgn:
    newShape->param.gen.a    = sin( myPI * (coords[6] / 180.0) );
    newShape->param.gen.b    = cos( myPI * (coords[6] / 180.0) );
    newShape->param.gen.sinT = sin( myPI * (coords[7] / 180.0) );
    newShape->param.gen.cosT = cos( myPI * (coords[7] / 180.0) );
    break;
  case rectangle_rgn:
    newShape->param.gen.sinT = sin( myPI * (coords[4] / 180.0) );
    newShape->param.gen.cosT = cos( myPI * (coords[4] / 180.0) );
    X = 0.5 * ( coords[2]-coords[0] );
    Y = 0.5 * ( coords[3]-coords[1] );
    newShape->param.gen.a = fabs( X * newShape->param.gen.cosT
				  + Y * newShape->param.gen.sinT );
    newShape->param.gen.b = fabs( Y * newShape->param.gen.cosT
				  - X * newShape->param.gen.sinT );
    newShape->param.gen.p[5] = 0.5 * ( coords[2]+coords[0] );
    newShape->param.gen.p[6] = 0.5 * ( coords[3]+coords[1] );
    break;
  case diamond_rgn:
    newShape->param.gen.sinT = sin( myPI * (coords[4] / 180.0) );
    newShape->param.gen.cosT = cos( myPI * (coords[4] / 180.0) );
    break;
  case line_rgn:
    X = coords[2] - coords[0];
    Y = coords[3] - coords[1];
    R = sqrt( X*X + Y*Y );
    newShape->param.gen.sinT = ( R ? Y/R : 0.0 );
    newShape->param.gen.cosT = ( R ? X/R : 1.0 );
    newShape->param.gen.a    = R + 0.5;
    break;
  case panda_rgn:
    while( coords[2]> 180.0 ) coords[2] -= 360.0;
    while( coords[2]<=-180.0 ) coords[2] += 360.0;
    while( coords[3]> 180.0 ) coords[3] -= 360.0;
    while( coords[3]<=-180.0 ) coords[3] += 360.0;
    newShape->param.gen.a = newShape->param.gen.p[5]*newShape->param.gen.p[5];
    newShape->param.gen.b = newShape->param.gen.p[6]*newShape->param.gen.p[6];
    break;
  case epanda_rgn:
  case bpanda_rgn:
    while( coords[2]> 180.0 ) coords[2] -= 360.0;
    while( coords[2]<=-180.0 ) coords[2] += 360.0;
    while( coords[3]> 180.0 ) coords[3] -= 360.0;
    while( coords[3]<=-180.0 ) coords[3] += 360.0;
    newShape->param.gen.sinT = sin( myPI * (coords[10] / 180.0) );
    newShape->param.gen.cosT = cos( myPI * (coords[10] / 180.0) );
    break;
  default:
    break;
  }

  /*  Set the xmin, xmax, ymin, ymax elements of the RgnShape structure */

  /* For everything which has first two parameters as center position just */
  /* find a circle that encompasses the region and use it to set the       */
  /* bounding box                                                          */

  R = -1.0;

  switch ( newShape->shape ) {

  case circle_rgn:
    R = coords[2];
    break;

  case annulus_rgn:
    R = coords[3];
    break;

  case ellipse_rgn:
    if ( coords[2] > coords[3] ) {
      R = coords[2];
    } else {
      R = coords[3];
    }
    break;

  case elliptannulus_rgn:
    if ( coords[4] > coords[5] ) {
      R = coords[4];
    } else {
      R = coords[5];
    }
    break;

  case box_rgn:
    R = sqrt(coords[2]*coords[2]+
	     coords[3]*coords[3])/2.0;
    break;

  case boxannulus_rgn:
    R = sqrt(coords[4]*coords[5]+
	     coords[4]*coords[5])/2.0;
    break;

  case diamond_rgn:
    if ( coords[2] > coords[3] ) {
      R = coords[2]/2.0;
    } else {
      R = coords[3]/2.0;
    }
    break;
    
  case point_rgn:
    R = 1.0;
    break;

  case panda_rgn:
    R = coords[6];
    break;

  case epanda_rgn:
    if ( coords[7] > coords[8] ) {
      R = coords[7];
    } else {
      R = coords[8];
    }
    break;

  case bpanda_rgn:
    R = sqrt(coords[7]*coords[8]+
	     coords[7]*coords[8])/2.0;
    break;

  default:
    break;
  }

  if ( R > 0.0 ) {

    newShape->xmin = coords[0] - R;
    newShape->xmax = coords[0] + R;
    newShape->ymin = coords[1] - R;
    newShape->ymax = coords[1] + R;

    return;

  }

  /* Now do the rest of the shapes that require individual methods */

  switch ( newShape->shape ) {

  case rectangle_rgn:
    R = sqrt((coords[5]-coords[0])*(coords[5]-coords[0])+
	     (coords[6]-coords[1])*(coords[6]-coords[1]));
    newShape->xmin = coords[5] - R;
    newShape->xmax = coords[5] + R;
    newShape->ymin = coords[6] - R;
    newShape->ymax = coords[6] + R;
    break;

  case poly_rgn:
    newShape->xmin = coords[0];
    newShape->xmax = coords[0];
    newShape->ymin = coords[1];
    newShape->ymax = coords[1];
    for( i=2; i < newShape->param.poly.nPts; ) {
      if( newShape->xmin > coords[i] ) /* Min X */
	newShape->xmin = coords[i];
      if( newShape->xmax < coords[i] ) /* Max X */
	newShape->xmax = coords[i];
      i++;
      if( newShape->ymin > coords[i] ) /* Min Y */
	newShape->ymin = coords[i];
      if( newShape->ymax < coords[i] ) /* Max Y */
	newShape->ymax = coords[i];
      i++;
    }
    break;

  case line_rgn:
    if ( coords[0] > coords[2] ) {
      newShape->xmin = coords[2];
      newShape->xmax = coords[0];
    } else {
      newShape->xmin = coords[0];
      newShape->xmax = coords[2];
    }
    if ( coords[1] > coords[3] ) {
      newShape->ymin = coords[3];
      newShape->ymax = coords[1];
    } else {
      newShape->ymin = coords[1];
      newShape->ymax = coords[3];
    }

    break;

    /* sector doesn't have min and max so indicate by setting max < min */

  case sector_rgn:
    newShape->xmin = 1.0;
    newShape->xmax = -1.0;
    newShape->ymin = 1.0;
    newShape->ymax = -1.0;
    break;

  default:
    break;
  }

  return;

}